

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::NegativeFramebufferCase::getFormatSamples
          (NegativeFramebufferCase *this,GLenum target,vector<int,_std::allocator<int>_> *samples)

{
  code *pcVar1;
  code *pcVar2;
  uint in_EAX;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  int sampleCount;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar3) + 0x800);
  pcVar2 = *(code **)(CONCAT44(extraout_var,iVar3) + 0x880);
  uStack_38 = (ulong)(uint)uStack_38;
  (*pcVar2)(target,this->m_internalFormat,0x9380,1,(long)&uStack_38 + 4);
  std::vector<int,_std::allocator<int>_>::resize(samples,(long)uStack_38._4_4_);
  if (0 < uStack_38._4_4_) {
    (*pcVar2)(target,this->m_internalFormat,0x80a9,uStack_38._4_4_,
              (samples->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start);
    err = (*pcVar1)();
    glu::checkError(err,"get max samples",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                    ,0x702);
  }
  return;
}

Assistant:

void NegativeFramebufferCase::getFormatSamples (glw::GLenum target, std::vector<int>& samples)
{
	const glw::Functions	gl			= m_context.getRenderContext().getFunctions();
	int						sampleCount	= 0;

	gl.getInternalformativ(target, m_internalFormat, GL_NUM_SAMPLE_COUNTS, 1, &sampleCount);
	samples.resize(sampleCount);

	if (sampleCount > 0)
	{
		gl.getInternalformativ(target, m_internalFormat, GL_SAMPLES, sampleCount, &samples[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "get max samples");
	}
}